

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageColorInvert(Image *image)

{
  int iVar1;
  uint uVar2;
  Image image_00;
  Color *pCVar3;
  uchar *puVar4;
  undefined8 unaff_RBP;
  long lVar5;
  ulong uVar6;
  undefined8 unaff_R14;
  undefined8 unaff_retaddr;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    image_00._8_8_ = unaff_RBP;
    image_00.data = (void *)unaff_R14;
    image_00._16_8_ = unaff_retaddr;
    pCVar3 = LoadImageColors(image_00);
    iVar1 = image->height;
    if (0 < (long)iVar1) {
      uVar2 = image->width;
      puVar4 = &pCVar3->b;
      lVar5 = 0;
      do {
        if (0 < (int)uVar2) {
          uVar6 = 0;
          do {
            puVar4[uVar6 * 4 + -2] = ~puVar4[uVar6 * 4 + -2];
            puVar4[uVar6 * 4 + -1] = ~puVar4[uVar6 * 4 + -1];
            puVar4[uVar6 * 4] = ~puVar4[uVar6 * 4];
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        lVar5 = lVar5 + 1;
        puVar4 = puVar4 + (ulong)uVar2 * 4;
      } while (lVar5 != iVar1);
    }
    iVar1 = image->format;
    free(image->data);
    image->data = pCVar3;
    image->format = 7;
    ImageFormat(image,iVar1);
    return;
  }
  return;
}

Assistant:

void ImageColorInvert(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    Color *pixels = LoadImageColors(*image);

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            pixels[y*image->width + x].r = 255 - pixels[y*image->width + x].r;
            pixels[y*image->width + x].g = 255 - pixels[y*image->width + x].g;
            pixels[y*image->width + x].b = 255 - pixels[y*image->width + x].b;
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}